

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampler_set_rate_ratio(ma_resampler *pResampler,float ratio)

{
  int iVar1;
  long in_RDI;
  float in_XMM0_Da;
  ma_uint32 d;
  ma_uint32 n;
  ma_uint32 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (0.0 < in_XMM0_Da) {
    iVar1 = (int)(long)(in_XMM0_Da * 1000.0);
    if (iVar1 == 0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      local_4 = ma_resampler_set_rate
                          ((ma_resampler *)CONCAT44(in_XMM0_Da,iVar1),1000,in_stack_ffffffffffffffe0
                          );
    }
  }
  else {
    local_4 = MA_INVALID_ARGS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_resampler_set_rate_ratio(ma_resampler* pResampler, float ratio)
{
    ma_uint32 n;
    ma_uint32 d;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (ratio <= 0) {
        return MA_INVALID_ARGS;
    }

    d = 1000;
    n = (ma_uint32)(ratio * d);

    if (n == 0) {
        return MA_INVALID_ARGS; /* Ratio too small. */
    }

    MA_ASSERT(n != 0);

    return ma_resampler_set_rate(pResampler, n, d);
}